

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rootwindow.cpp
# Opt level: O1

Node * __thiscall RootWindow::build(RootWindow *this)

{
  undefined1 *puVar1;
  pointer *pppSVar2;
  byte bVar3;
  SignalEmitter *pSVar4;
  iterator __position;
  GlyphContext *this_00;
  ostream *poVar5;
  Node *this_01;
  OpacityNode *pOVar6;
  LayoutNode *pLVar7;
  Example *pEVar8;
  sockaddr *__addr;
  Button *this_02;
  float extraout_XMM0_Da;
  float fVar9;
  float extraout_XMM0_Db;
  float fVar10;
  rect2d rect;
  _Any_data local_88;
  code *local_78;
  code *pcStack_70;
  string local_68;
  float local_48;
  Units local_34 [2];
  Units units;
  
  this_00 = (GlyphContext *)operator_new(0x40);
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"OpenSans-Regular.ttf","");
  rengine::GlyphContext::GlyphContext(this_00,&local_68);
  this->m_font = this_00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  if (this->m_font->m_fontData == (uchar *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Failed to load \'",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"OpenSans-Regular.ttf",0x14);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'...",4);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'p');
    std::ostream::put('p');
    poVar5 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"The font file needs to be downloaded separately and placed next",0x3f);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    poVar5 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"to the \'demo\' binary.",0x15);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
  }
  if (this->m_font->m_fontData != (uchar *)0x0) {
    (*((this->super_StandardSurface).super_Surface.m_impl)->_vptr_SurfaceBackendImpl[10])();
    local_48 = extraout_XMM0_Db;
    (*((this->super_StandardSurface).super_Surface.m_impl)->_vptr_SurfaceBackendImpl[6])();
    this_01 = rengine::Node::create();
    pOVar6 = rengine::OpacityNode::create();
    this->m_appLayer = pOVar6;
    pLVar7 = rengine::LayoutNode::create();
    this->m_buttonGrid = pLVar7;
    if ((pLVar7->field_0x5c & 4) == 0) {
      pLVar7->field_0x5c = pLVar7->field_0x5c | 4;
    }
    pSVar4 = (SignalEmitter *)this->m_buttonGrid;
    bVar3 = *(byte *)((long)&pSVar4[5].m_buckets + 4);
    if ((bVar3 & 3) != 0) {
      *(byte *)((long)&pSVar4[5].m_buckets + 4) = bVar3 & 0xfc;
      rengine::Signal<>::emit(&rengine::LayoutNode::onLayoutTypeChanged,pSVar4);
    }
    pSVar4 = (SignalEmitter *)this->m_buttonGrid;
    fVar9 = local_48 / 25.4 + local_48 / 25.4;
    if (fVar9 <= 10.0) {
      fVar9 = 10.0;
    }
    local_48 = roundf(fVar9);
    fVar10 = local_48 * 15.0;
    fVar9 = *(float *)((long)&pSVar4[4].m_buckets + 4);
    if ((fVar9 != fVar10) || (NAN(fVar9) || NAN(fVar10))) {
      *(float *)((long)&pSVar4[4].m_buckets + 4) = fVar10;
      rengine::Signal<>::emit(&rengine::LayoutNode::onCellWidthChanged,pSVar4);
    }
    pSVar4 = (SignalEmitter *)this->m_buttonGrid;
    fVar9 = local_48 * 3.0;
    if ((*(float *)&pSVar4[5]._vptr_SignalEmitter != fVar9) ||
       (NAN(*(float *)&pSVar4[5]._vptr_SignalEmitter) || NAN(fVar9))) {
      *(float *)&pSVar4[5]._vptr_SignalEmitter = fVar9;
      rengine::Signal<>::emit(&rengine::LayoutNode::onCellHeightChanged,pSVar4);
    }
    pSVar4 = (SignalEmitter *)this->m_buttonGrid;
    if ((*(float *)&pSVar4[3].m_buckets != local_48) ||
       (NAN(*(float *)&pSVar4[3].m_buckets) || NAN(local_48))) {
      *(float *)&pSVar4[3].m_buckets = local_48;
      rengine::Signal<>::emit(&rengine::LayoutNode::onSpacingChanged,pSVar4);
    }
    pSVar4 = (SignalEmitter *)this->m_buttonGrid;
    fVar9 = *(float *)((long)&pSVar4[3]._vptr_SignalEmitter + 4);
    if ((fVar9 != local_48) || (NAN(fVar9) || NAN(local_48))) {
      *(float *)((long)&pSVar4[3]._vptr_SignalEmitter + 4) = local_48;
      rengine::Signal<>::emit(&rengine::LayoutNode::onMarginChanged,pSVar4);
    }
    pSVar4 = (SignalEmitter *)this->m_buttonGrid;
    if (*(int *)((long)&pSVar4[5]._vptr_SignalEmitter + 4) != 1) {
      *(undefined4 *)((long)&pSVar4[5]._vptr_SignalEmitter + 4) = 1;
      rengine::Signal<>::emit(&rengine::LayoutNode::onColumnCountchanged,pSVar4);
    }
    pSVar4 = (SignalEmitter *)this->m_buttonGrid;
    fVar10 = extraout_XMM0_Da * 0.5 - *(float *)((long)&pSVar4[4].m_buckets + 4) * 0.5;
    fVar9 = *(float *)((long)&pSVar4[3].m_buckets + 4);
    if ((fVar9 != fVar10) || (NAN(fVar9) || NAN(fVar10))) {
      *(float *)((long)&pSVar4[3].m_buckets + 4) = fVar10;
      rengine::Signal<>::emit(&rengine::LayoutNode::onXChanged,pSVar4);
    }
    pEVar8 = (Example *)operator_new(0x58);
    (pEVar8->super_Node).super_SignalEmitter._vptr_SignalEmitter = (_func_int **)0x0;
    (pEVar8->super_Node).super_SignalEmitter.m_buckets =
         (vector<rengine::SignalEmitter::BucketBase_*,_std::allocator<rengine::SignalEmitter::BucketBase_*>_>
          *)0x0;
    *(undefined8 *)&(pEVar8->super_Node).field_0x30 = 0;
    pEVar8->m_window = (RootWindow *)0x0;
    (pEVar8->super_Node).m_parent = (Node *)0x0;
    (pEVar8->super_Node).m_child = (Node *)0x0;
    (pEVar8->super_Node).m_next = (Node *)0x0;
    (pEVar8->super_Node).m_prev = (Node *)0x0;
    pEVar8[1].super_Node.super_SignalEmitter._vptr_SignalEmitter = (_func_int **)0x0;
    pEVar8[1].super_Node.super_SignalEmitter.m_buckets =
         (vector<rengine::SignalEmitter::BucketBase_*,_std::allocator<rengine::SignalEmitter::BucketBase_*>_>
          *)0x0;
    pEVar8[1].super_Node.m_parent = (Node *)0x0;
    (pEVar8->super_Node).super_SignalEmitter.m_buckets =
         (vector<rengine::SignalEmitter::BucketBase_*,_std::allocator<rengine::SignalEmitter::BucketBase_*>_>
          *)0x0;
    puVar1 = &(pEVar8->super_Node).field_0x30;
    *(uint *)puVar1 = *(uint *)puVar1 & 0xfffff800;
    pEVar8->m_window = (RootWindow *)0x0;
    (pEVar8->super_Node).super_SignalEmitter._vptr_SignalEmitter =
         (_func_int **)&PTR__Rectangles_00148820;
    add(this,pEVar8,local_34);
    pEVar8 = (Example *)operator_new(0x50);
    (pEVar8->super_Node).super_SignalEmitter._vptr_SignalEmitter = (_func_int **)0x0;
    (pEVar8->super_Node).super_SignalEmitter.m_buckets =
         (vector<rengine::SignalEmitter::BucketBase_*,_std::allocator<rengine::SignalEmitter::BucketBase_*>_>
          *)0x0;
    *(undefined8 *)&(pEVar8->super_Node).field_0x30 = 0;
    pEVar8->m_window = (RootWindow *)0x0;
    (pEVar8->super_Node).m_parent = (Node *)0x0;
    (pEVar8->super_Node).m_child = (Node *)0x0;
    (pEVar8->super_Node).m_next = (Node *)0x0;
    (pEVar8->super_Node).m_prev = (Node *)0x0;
    pEVar8[1].super_Node.super_SignalEmitter._vptr_SignalEmitter = (_func_int **)0x0;
    pEVar8[1].super_Node.super_SignalEmitter.m_buckets =
         (vector<rengine::SignalEmitter::BucketBase_*,_std::allocator<rengine::SignalEmitter::BucketBase_*>_>
          *)0x0;
    (pEVar8->super_Node).super_SignalEmitter.m_buckets =
         (vector<rengine::SignalEmitter::BucketBase_*,_std::allocator<rengine::SignalEmitter::BucketBase_*>_>
          *)0x0;
    puVar1 = &(pEVar8->super_Node).field_0x30;
    *(uint *)puVar1 = *(uint *)puVar1 & 0xfffff800;
    pEVar8->m_window = (RootWindow *)0x0;
    (pEVar8->super_Node).super_SignalEmitter._vptr_SignalEmitter =
         (_func_int **)&PTR__LayeredOpacity_001488f0;
    add(this,pEVar8,local_34);
    pEVar8 = (Example *)operator_new(0x58);
    (pEVar8->super_Node).super_SignalEmitter._vptr_SignalEmitter = (_func_int **)0x0;
    (pEVar8->super_Node).super_SignalEmitter.m_buckets =
         (vector<rengine::SignalEmitter::BucketBase_*,_std::allocator<rengine::SignalEmitter::BucketBase_*>_>
          *)0x0;
    *(undefined8 *)&(pEVar8->super_Node).field_0x30 = 0;
    pEVar8->m_window = (RootWindow *)0x0;
    (pEVar8->super_Node).m_parent = (Node *)0x0;
    (pEVar8->super_Node).m_child = (Node *)0x0;
    (pEVar8->super_Node).m_next = (Node *)0x0;
    (pEVar8->super_Node).m_prev = (Node *)0x0;
    pEVar8[1].super_Node.super_SignalEmitter._vptr_SignalEmitter = (_func_int **)0x0;
    pEVar8[1].super_Node.super_SignalEmitter.m_buckets =
         (vector<rengine::SignalEmitter::BucketBase_*,_std::allocator<rengine::SignalEmitter::BucketBase_*>_>
          *)0x0;
    pEVar8[1].super_Node.m_parent = (Node *)0x0;
    (pEVar8->super_Node).super_SignalEmitter.m_buckets =
         (vector<rengine::SignalEmitter::BucketBase_*,_std::allocator<rengine::SignalEmitter::BucketBase_*>_>
          *)0x0;
    puVar1 = &(pEVar8->super_Node).field_0x30;
    *(uint *)puVar1 = *(uint *)puVar1 & 0xfffff800;
    pEVar8->m_window = (RootWindow *)0x0;
    (pEVar8->super_Node).super_SignalEmitter._vptr_SignalEmitter =
         (_func_int **)&PTR__BlurExample_00148958;
    add(this,pEVar8,local_34);
    pEVar8 = (Example *)operator_new(0x58);
    (pEVar8->super_Node).super_SignalEmitter._vptr_SignalEmitter = (_func_int **)0x0;
    (pEVar8->super_Node).super_SignalEmitter.m_buckets =
         (vector<rengine::SignalEmitter::BucketBase_*,_std::allocator<rengine::SignalEmitter::BucketBase_*>_>
          *)0x0;
    *(undefined8 *)&(pEVar8->super_Node).field_0x30 = 0;
    pEVar8->m_window = (RootWindow *)0x0;
    (pEVar8->super_Node).m_parent = (Node *)0x0;
    (pEVar8->super_Node).m_child = (Node *)0x0;
    (pEVar8->super_Node).m_next = (Node *)0x0;
    (pEVar8->super_Node).m_prev = (Node *)0x0;
    pEVar8[1].super_Node.super_SignalEmitter._vptr_SignalEmitter = (_func_int **)0x0;
    pEVar8[1].super_Node.super_SignalEmitter.m_buckets =
         (vector<rengine::SignalEmitter::BucketBase_*,_std::allocator<rengine::SignalEmitter::BucketBase_*>_>
          *)0x0;
    pEVar8[1].super_Node.m_parent = (Node *)0x0;
    (pEVar8->super_Node).super_SignalEmitter.m_buckets =
         (vector<rengine::SignalEmitter::BucketBase_*,_std::allocator<rengine::SignalEmitter::BucketBase_*>_>
          *)0x0;
    puVar1 = &(pEVar8->super_Node).field_0x30;
    *(uint *)puVar1 = *(uint *)puVar1 & 0xfffff800;
    pEVar8->m_window = (RootWindow *)0x0;
    (pEVar8->super_Node).super_SignalEmitter._vptr_SignalEmitter =
         (_func_int **)&PTR__ShadowExample_00148aa0;
    add(this,pEVar8,local_34);
    rengine::LayoutEngine::updateLayout
              ((LayoutEngine *)&(this->m_buttonGrid->super_Node).field_0x34,
               &this->m_buttonGrid->super_Node);
    rengine::Node::append(this_01,&this->m_buttonGrid->super_Node);
    rengine::Node::append(this_01,&this->m_appLayer->super_Node);
    __addr = (sockaddr *)operator_new(0x28);
    local_88._8_8_ = 0;
    pcStack_70 = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/examples/rootwindow.cpp:80:70)>
                 ::_M_invoke;
    local_78 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/examples/rootwindow.cpp:80:70)>
               ::_M_manager;
    *(undefined ***)__addr = &PTR__SignalHandler_Function_00148658;
    local_88._M_unused._M_object = this;
    std::function<void_()>::function
              ((function<void_()> *)(__addr->sa_data + 6),(function<void_()> *)&local_88);
    if (local_78 != (code *)0x0) {
      (*local_78)(&local_88,&local_88,__destroy_functor);
    }
    __position._M_current =
         (this->m_buttonSignalHandlers).
         super__Vector_base<rengine::SignalHandler<>_*,_std::allocator<rengine::SignalHandler<>_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_68._M_dataplus._M_p = (pointer)__addr;
    if (__position._M_current ==
        (this->m_buttonSignalHandlers).
        super__Vector_base<rengine::SignalHandler<>_*,_std::allocator<rengine::SignalHandler<>_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<rengine::SignalHandler<>*,std::allocator<rengine::SignalHandler<>*>>::
      _M_realloc_insert<rengine::SignalHandler<>*>
                ((vector<rengine::SignalHandler<>*,std::allocator<rengine::SignalHandler<>*>> *)
                 &this->m_buttonSignalHandlers,__position,(SignalHandler<> **)&local_68);
    }
    else {
      *__position._M_current = (SignalHandler<> *)__addr;
      pppSVar2 = &(this->m_buttonSignalHandlers).
                  super__Vector_base<rengine::SignalHandler<>_*,_std::allocator<rengine::SignalHandler<>_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppSVar2 = *pppSVar2 + 1;
    }
    this_02 = createTextButton(this,"Close",local_34);
    this->m_closeButton = this_02;
    pLVar7 = this->m_buttonGrid;
    fVar9 = *(float *)&(pLVar7->super_Node).field_0x34;
    rect.br.x = *(float *)&pLVar7->field_0x4c + fVar9;
    rect.br.y = *(float *)&pLVar7->field_0x50 + fVar9;
    rect.tl.y = fVar9;
    rect.tl.x = fVar9;
    rengine::RectangleNodeBase::setGeometry(&this_02->super_RectangleNodeBase,rect);
    rengine::Signal<>::connect(&Button::onClicked,(int)this->m_closeButton,__addr,(socklen_t)pLVar7)
    ;
    return this_01;
  }
  __assert_fail("m_font->isValid()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/examples/rootwindow.cpp"
                ,0x2f,"virtual Node *RootWindow::build()");
}

Assistant:

Node *RootWindow::build()
{
    const char *fontFile = "OpenSans-Regular.ttf";
    m_font = new GlyphContext(fontFile);
    if (!m_font->isValid()) {
        cerr << "Failed to load '" << fontFile << "'..." << endl
             << "The font file needs to be downloaded separately and placed next" << endl
             << "to the 'demo' binary." << endl;
    }
    assert(m_font->isValid());

    Units units(this);
    vec2 windowSize = size();

    Node *root = Node::create();

    // Prepare the app layer
    m_appLayer = OpacityNode::create();


    // Prepare the button grid
    m_buttonGrid = LayoutNode::create();
    m_buttonGrid->setActivationMode(LayoutNode::Explicit);
    m_buttonGrid->setLayoutType(LayoutEngine::Grid_Horizontal);
    m_buttonGrid->setCellWidth(units.base() * 15.0f);
    m_buttonGrid->setCellHeight(units.base() * 3.0f);
    m_buttonGrid->setSpacing(units.base() * 1.0f);
    m_buttonGrid->setMargin(units.base() * 1.0f);
    m_buttonGrid->setColumnCount(1);
    m_buttonGrid->setX(windowSize.x / 2 - m_buttonGrid->cellWidth() / 2);

    add(new Rectangles(), units);
    add(new LayeredOpacity(), units);
    add(new BlurExample(), units);
    add(new ShadowExample(), units);

    m_buttonGrid->updateLayout();

    root->append(m_buttonGrid);
    root->append(m_appLayer);

    // The close button..
    SignalHandler_Function<> *handler = new SignalHandler_Function<>([this] () { closeExample(); });
    m_buttonSignalHandlers.push_back(handler);
    m_closeButton = createTextButton("Close", units);
    m_closeButton->setGeometry(rect2d::fromXywh(m_buttonGrid->margin(), m_buttonGrid->margin(),
                                                m_buttonGrid->cellWidth(), m_buttonGrid->cellHeight()));

    Button::onClicked.connect(m_closeButton, handler);

    return root;
}